

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_utils.cpp
# Opt level: O2

ostream * wv::operator<<(ostream *os,sentence *sent)

{
  ostream *poVar1;
  size_t i;
  ulong uVar2;
  long lVar3;
  
  std::operator<<(os,"[");
  lVar3 = 0;
  for (uVar2 = 0;
      uVar2 < (ulong)((long)(sent->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(sent->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start >> 5); uVar2 = uVar2 + 1) {
    poVar1 = std::operator<<(os,"\'");
    poVar1 = std::operator<<(poVar1,(string *)
                                    ((long)&(((sent->
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              )._M_impl.super__Vector_impl_data._M_start)->
                                            _M_dataplus)._M_p + lVar3));
    std::operator<<(poVar1,"\'");
    if (uVar2 != ((long)(sent->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                  (long)(sent->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start >> 5) - 1U) {
      std::operator<<(os," ");
    }
    lVar3 = lVar3 + 0x20;
  }
  std::operator<<(os,"]");
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const sentence& sent) {
    os << "[";
    for(size_t i=0; i<sent.size(); ++i){
        os << "'" << sent[i] << "'";
        if(i != sent.size()-1)
            os << " ";
    }
    os << "]";
    return os;
}